

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

void RigidBodyDynamics::Utils::CalcCenterOfMass
               (Model *model,VectorNd *q,VectorNd *qdot,double *mass,Vector3d *com,
               Vector3d *com_velocity,Vector3d *angular_momentum,bool update_kinematics)

{
  uint uVar1;
  Vector3_t *pVVar2;
  reference pvVar3;
  undefined8 *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  long in_R9;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *in_stack_00000008;
  byte in_stack_00000010;
  uint lambda;
  size_t i_1;
  SpatialVector htot;
  SpatialRigidBodyInertia Itot;
  size_t i;
  SpatialRigidBodyInertia *in_stack_fffffffffffffa38;
  SpatialRigidBodyInertia *in_stack_fffffffffffffa40;
  double in_stack_fffffffffffffa48;
  SpatialRigidBodyInertia *in_stack_fffffffffffffa50;
  reference in_stack_fffffffffffffa60;
  reference in_stack_fffffffffffffa68;
  reference in_stack_fffffffffffffa78;
  reference in_stack_fffffffffffffa80;
  reference in_stack_fffffffffffffa88;
  Vector3_t *this;
  Vector3d *in_stack_fffffffffffffa98;
  SpatialRigidBodyInertia *in_stack_fffffffffffffac0;
  SpatialRigidBodyInertia *in_stack_fffffffffffffac8;
  SpatialVector *in_stack_fffffffffffffbc0;
  SpatialTransform *in_stack_fffffffffffffbc8;
  SpatialRigidBodyInertia *in_stack_fffffffffffffbe8;
  SpatialVector *in_stack_fffffffffffffc00;
  SpatialTransform *in_stack_fffffffffffffc08;
  size_type local_2a0;
  SpatialRigidBodyInertia *in_stack_fffffffffffffdb8;
  SpatialTransform *in_stack_fffffffffffffdc0;
  VectorNd *in_stack_fffffffffffffdc8;
  Model *in_stack_fffffffffffffdd0;
  undefined8 local_1c8;
  Vector3_t *local_40;
  
  if ((in_stack_00000010 & 1) != 0) {
    UpdateKinematicsCustom
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (VectorNd *)in_stack_fffffffffffffdc0,(VectorNd *)in_stack_fffffffffffffdb8);
  }
  local_40 = (Vector3_t *)0x1;
  while (this = local_40,
        pVVar2 = (Vector3_t *)
                 std::
                 vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         *)&in_RDI[0x20].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish), this < pVVar2) {
    in_stack_fffffffffffffa88 =
         std::
         vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
         ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                       *)(in_RDI + 0x1a),(size_type)local_40);
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  *)(in_RDI + 0x1b),(size_type)local_40);
    Math::SpatialRigidBodyInertia::operator=(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
    std::
    vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
    ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                  *)(in_RDI + 0x1b),(size_type)local_40);
    Math::SpatialRigidBodyInertia::toMatrix(in_stack_fffffffffffffbe8);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               &in_RDI[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(size_type)local_40);
    Eigen::MatrixBase<Eigen::Matrix<double,6,6,0,6,6>>::operator*
              ((MatrixBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)in_stack_fffffffffffffa40,
               (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffa38);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
               (in_RDI + 0x1c),(size_type)local_40);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_fffffffffffffa40,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                *)in_stack_fffffffffffffa38);
    local_40 = (Vector3_t *)
               ((long)(local_40->super_Vector3d).
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 1);
  }
  Vector3_t::Vector3_t
            (this,&in_stack_fffffffffffffa88->m,(double *)in_stack_fffffffffffffa80,
             (double *)in_stack_fffffffffffffa78);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero
            ((Index)in_stack_fffffffffffffa48,(Index)in_stack_fffffffffffffa40);
  Matrix3_t::
  Matrix3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix3_t *)in_stack_fffffffffffffa40,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_fffffffffffffa38);
  Math::SpatialRigidBodyInertia::SpatialRigidBodyInertia
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             (Vector3d *)in_stack_fffffffffffffa40,(Matrix3d *)in_stack_fffffffffffffa38);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::Zero((Index)in_stack_fffffffffffffa48);
  SpatialVector_t::
  SpatialVector_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
            ((SpatialVector_t *)in_stack_fffffffffffffa40,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
              *)in_stack_fffffffffffffa38);
  local_2a0 = std::
              vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
              size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&in_RDI[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  while (local_2a0 = local_2a0 - 1, local_2a0 != 0) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](in_RDI,local_2a0);
    uVar1 = *pvVar3;
    if (uVar1 == 0) {
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(in_RDI + 0x1d),local_2a0);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1b),local_2a0);
      Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      Math::SpatialRigidBodyInertia::operator+(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      Math::SpatialRigidBodyInertia::operator=(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      in_stack_fffffffffffffa60 =
           std::
           vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                         *)(in_RDI + 0x1d),local_2a0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RDI + 0x1c),local_2a0);
      Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffa68,
                 (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffa60);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffa40,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                  *)in_stack_fffffffffffffa38);
    }
    else {
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1b),(ulong)uVar1);
      in_stack_fffffffffffffa68 =
           std::
           vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                         *)(in_RDI + 0x1d),local_2a0);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1b),local_2a0);
      Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      Math::SpatialRigidBodyInertia::operator+(in_stack_fffffffffffffac8,in_stack_fffffffffffffac0);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(in_RDI + 0x1b),(ulong)uVar1);
      Math::SpatialRigidBodyInertia::operator=(in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      in_stack_fffffffffffffa80 =
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      (in_RDI + 0x1c),(ulong)uVar1);
      in_stack_fffffffffffffa78 =
           std::
           vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                         *)(in_RDI + 0x1d),local_2a0);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RDI + 0x1c),local_2a0);
      Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffa68,
                 (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffa60);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RDI + 0x1c),(ulong)uVar1);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffa40,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                  *)in_stack_fffffffffffffa38);
    }
  }
  *in_RCX = local_1c8;
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffa88,
             (double *)in_stack_fffffffffffffa80);
  Vector3_t::operator=
            ((Vector3_t *)in_stack_fffffffffffffa40,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_fffffffffffffa38);
  if (in_R9 != 0) {
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)in_stack_fffffffffffffa40
               ,(Index)in_stack_fffffffffffffa38);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)in_stack_fffffffffffffa40
               ,(Index)in_stack_fffffffffffffa38);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
              ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)in_stack_fffffffffffffa40
               ,(Index)in_stack_fffffffffffffa38);
    Vector3_t::Vector3_t
              (this,&in_stack_fffffffffffffa88->m,(double *)in_stack_fffffffffffffa80,
               (double *)in_stack_fffffffffffffa78);
    Vector3_t::operator=
              ((Vector3_t *)in_stack_fffffffffffffa40,(Vector3_t *)in_stack_fffffffffffffa38);
  }
  if (in_stack_00000008 != (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)0x0) {
    Math::Xtrans(in_stack_fffffffffffffa98);
    Math::SpatialTransform::applyAdjoint(in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_fffffffffffffa40,
               (SpatialVector_t *)in_stack_fffffffffffffa38);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
              (in_stack_00000008,(Index)in_stack_fffffffffffffa38);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
              (in_stack_00000008,(Index)in_stack_fffffffffffffa38);
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
              (in_stack_00000008,(Index)in_stack_fffffffffffffa38);
    Vector3_t::set(this,&in_stack_fffffffffffffa88->m,(double *)in_stack_fffffffffffffa80,
                   (double *)in_stack_fffffffffffffa78);
  }
  return;
}

Assistant:

RBDL_DLLAPI void CalcCenterOfMass (Model &model, const Math::VectorNd &q, const Math::VectorNd &qdot, double &mass, Math::Vector3d &com, Math::Vector3d *com_velocity, Vector3d *angular_momentum, bool update_kinematics) {
	if (update_kinematics)
		UpdateKinematicsCustom (model, &q, &qdot, NULL);

	for (size_t i = 1; i < model.mBodies.size(); i++) {
		model.Ic[i] = model.I[i];
		model.hc[i] = model.Ic[i].toMatrix() * model.v[i];
	}

	SpatialRigidBodyInertia Itot (0., Vector3d (0., 0., 0.), Matrix3d::Zero(3,3));
	SpatialVector htot (SpatialVector::Zero(6));

	for (size_t i = model.mBodies.size() - 1; i > 0; i--) {
		unsigned int lambda = model.lambda[i];

		if (lambda != 0) {
			model.Ic[lambda] = model.Ic[lambda] + model.X_lambda[i].applyTranspose (model.Ic[i]);
			model.hc[lambda] = model.hc[lambda] + model.X_lambda[i].applyTranspose (model.hc[i]);
		} else {
			Itot = Itot + model.X_lambda[i].applyTranspose (model.Ic[i]);
			htot = htot + model.X_lambda[i].applyTranspose (model.hc[i]);
		}
	}

	mass = Itot.m;
	com = Itot.h / mass;
	LOG << "mass = " << mass << " com = " << com.transpose() << " htot = " << htot.transpose() << std::endl;

	if (com_velocity) 
		*com_velocity = Vector3d (htot[3] / mass, htot[4] / mass, htot[5] / mass);

	if (angular_momentum) {
		htot = Xtrans (com).applyAdjoint (htot);
		angular_momentum->set (htot[0], htot[1], htot[2]);
	}
}